

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

NodeAndBucket __thiscall
google::protobuf::internal::
KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
FindHelper(KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,ViewType k)

{
  bool bVar1;
  map_index_t mVar2;
  NodeBase *pNVar3;
  NodeAndBucket NVar4;
  basic_string_view<char,_std::char_traits<char>_> __x;
  
  AssertLoadFactor(this);
  mVar2 = BucketNumber(this,k);
  pNVar3 = (NodeBase *)((this->super_UntypedMapBase).table_ + mVar2);
  do {
    pNVar3 = pNVar3->next;
    if (pNVar3 == (NodeBase *)0x0) break;
    __x._M_str = (char *)pNVar3[1].next;
    __x._M_len = (size_t)pNVar3[2].next;
    bVar1 = std::operator==(__x,k);
  } while (!bVar1);
  NVar4.bucket = mVar2;
  NVar4.node = pNVar3;
  NVar4._12_4_ = 0;
  return NVar4;
}

Assistant:

NodeAndBucket FindHelper(typename TS::ViewType k) const {
    AssertLoadFactor();
    map_index_t b = BucketNumber(k);
    for (auto* node = table_[b]; node != nullptr; node = node->next) {
      if (TS::ToView(static_cast<KeyNode*>(node)->key()) == k) {
        return {node, b};
      }
    }
    return {nullptr, b};
  }